

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_wrapper.hpp
# Opt level: O0

PyObject *
boost::python::objects::
class_cref_wrapper<StimulationCommand,_boost::python::objects::make_instance<StimulationCommand,_boost::python::objects::value_holder<StimulationCommand>_>_>
::convert(StimulationCommand *x)

{
  PyObject *pPVar1;
  StimulationCommand *in_RDI;
  reference_wrapper<const_StimulationCommand> *in_stack_00000008;
  undefined1 local_18 [16];
  undefined1 *local_8;
  
  local_8 = local_18;
  addressof<StimulationCommand_const>(in_RDI);
  pPVar1 = make_instance_impl<StimulationCommand,boost::python::objects::value_holder<StimulationCommand>,boost::python::objects::make_instance<StimulationCommand,boost::python::objects::value_holder<StimulationCommand>>>
           ::execute<boost::reference_wrapper<StimulationCommand_const>const>(in_stack_00000008);
  return pPVar1;
}

Assistant:

static PyObject* convert(Src const& x)
    {
        return MakeInstance::execute(boost::ref(x));
    }